

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomization_functions.c
# Opt level: O0

int16_t WebRtcSpl_RandUArray(int16_t *vector,int16_t vector_length,uint32_t *seed)

{
  int16_t iVar1;
  int local_24;
  int i;
  uint32_t *seed_local;
  int16_t vector_length_local;
  int16_t *vector_local;
  
  for (local_24 = 0; local_24 < vector_length; local_24 = local_24 + 1) {
    iVar1 = WebRtcSpl_RandU(seed);
    vector[local_24] = iVar1;
  }
  return vector_length;
}

Assistant:

int16_t WebRtcSpl_RandUArray(int16_t* vector,
                             int16_t vector_length,
                             uint32_t* seed) {
  int i;
  for (i = 0; i < vector_length; i++) {
    vector[i] = WebRtcSpl_RandU(seed);
  }
  return vector_length;
}